

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

void pybind11::detail::traverse_offset_bases
               (void *valueptr,type_info *tinfo,instance *self,_func_bool_void_ptr_instance_ptr *f)

{
  tuple_iterator tVar1;
  type_info *tinfo_00;
  long *plVar2;
  void *valueptr_00;
  sequence_fast_readonly sVar3;
  handle local_48;
  instance *local_40;
  _func_bool_void_ptr_instance_ptr *local_38;
  
  local_48.m_ptr = *(PyObject **)(*(long *)tinfo + 0x150);
  if (local_48.m_ptr != (PyObject *)0x0) {
    (local_48.m_ptr)->ob_refcnt = (local_48.m_ptr)->ob_refcnt + 1;
  }
  sVar3.ptr = (PyObject **)&local_48.m_ptr[1].ob_type;
  if (((local_48.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar3.ptr = (PyObject **)*sVar3.ptr;
  }
  local_40 = self;
  local_38 = f;
  tVar1 = tuple::end((tuple *)&local_48);
  do {
    if ((sequence_fast_readonly)sVar3.ptr == tVar1.super_sequence_fast_readonly.ptr) {
      object::~object((object *)&local_48);
      return;
    }
    tinfo_00 = get_type_info((PyTypeObject *)*sVar3.ptr);
    if (tinfo_00 != (type_info *)0x0) {
      plVar2 = *(long **)(tinfo_00 + 0x58);
      if (plVar2 != *(long **)(tinfo_00 + 0x60)) {
        do {
          if (*plVar2 == *(long *)(tinfo + 8)) {
            valueptr_00 = (void *)(*(code *)plVar2[1])(valueptr);
            if (valueptr_00 != valueptr) {
              (*local_38)(valueptr_00,local_40);
            }
            traverse_offset_bases(valueptr_00,tinfo_00,local_40,local_38);
            break;
          }
          plVar2 = plVar2 + 2;
        } while (plVar2 != *(long **)(tinfo_00 + 0x60));
      }
    }
    sVar3.ptr = sVar3.ptr + 1;
  } while( true );
}

Assistant:

inline void traverse_offset_bases(void *valueptr, const detail::type_info *tinfo, instance *self,
        bool (*f)(void * /*parentptr*/, instance * /*self*/)) {
    for (handle h : reinterpret_borrow<tuple>(tinfo->type->tp_bases)) {
        if (auto parent_tinfo = get_type_info((PyTypeObject *) h.ptr())) {
            for (auto &c : parent_tinfo->implicit_casts) {
                if (c.first == tinfo->cpptype) {
                    auto *parentptr = c.second(valueptr);
                    if (parentptr != valueptr)
                        f(parentptr, self);
                    traverse_offset_bases(parentptr, parent_tinfo, self, f);
                    break;
                }
            }
        }
    }
}